

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O0

MPP_RET process_slice(H264_SLICE_t *currSlice)

{
  undefined4 uVar1;
  undefined4 uVar2;
  MPP_RET MVar3;
  RK_S32 RVar4;
  byte local_95;
  RK_U32 local_94;
  RK_U32 local_90;
  RK_U32 _out_16;
  RK_U32 _out_15;
  RK_S32 _out_14;
  RK_S32 _out_13;
  RK_U32 _out_12;
  RK_S32 _out_11;
  RK_S32 _out_10;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_U32 _out_7;
  RK_U32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_U32 _out_2;
  RK_U32 _out_1;
  RK_U32 _out;
  RecoveryPoint *recovery;
  BitReadCtx_t *p_bitctx;
  H264dCurCtx_t *p_Cur;
  H264dVideoCtx_t *p_Vid;
  MPP_RET ret;
  RK_U32 emulation_prevention;
  RK_U32 poc_used_bits;
  RK_U32 temp;
  H264_SLICE_t *currSlice_local;
  
  emulation_prevention = 0;
  ret = MPP_OK;
  p_Vid._4_4_ = 0;
  p_Vid._0_4_ = MPP_ERR_UNKNOW;
  p_Cur = (H264dCurCtx_t *)currSlice->p_Vid;
  p_bitctx = (BitReadCtx_t *)currSlice->p_Cur;
  recovery = (RecoveryPoint *)&((h264d_cur_ctx_t *)p_bitctx)->bitctx;
  __out_1 = (RecoveryPoint *)
            ((p_Cur->sps).vui_seq_parameters.nal_hrd_parameters.bit_rate_value_minus1 + 0x16);
  currSlice->p_Dpb_layer[0] = *(h264_dpb_buf_t **)((p_Cur->sps).offset_for_ref_frame + 0x7f);
  currSlice->p_Dpb_layer[1] = *(h264_dpb_buf_t **)((p_Cur->sps).offset_for_ref_frame + 0x81);
  _poc_used_bits = currSlice;
  MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,&_out_2);
  recovery[3].first_frm_id = MVar3;
  if (recovery[3].first_frm_id == 0) {
    _poc_used_bits->start_mb_nr = _out_2;
    MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,(RK_U32 *)&_out_3);
    recovery[3].first_frm_id = MVar3;
    if (recovery[3].first_frm_id == 0) {
      emulation_prevention = _out_3;
      _poc_used_bits->slice_type = (uint)_out_3 % 5;
      (p_Cur->sps).gaps_in_frame_num_value_allowed_flag = (uint)_out_3 % 5;
      if (((p_Cur->sps).gaps_in_frame_num_value_allowed_flag == 3) ||
         ((p_Cur->sps).gaps_in_frame_num_value_allowed_flag == 4)) {
        if ((h264d_debug & 4) == 0) {
          return (MPP_RET)p_Vid;
        }
        _mpp_log_l(4,"h264d_slice","sp or si slice not support\n",(char *)0x0);
        return (MPP_RET)p_Vid;
      }
      MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,(RK_U32 *)&_out_4);
      recovery[3].first_frm_id = MVar3;
      if (recovery[3].first_frm_id == 0) {
        _poc_used_bits->pic_parameter_set_id = _out_4;
        init_slice_parmeters(_poc_used_bits);
        p_Vid._0_4_ = set_slice_user_parmeters(_poc_used_bits);
        if ((MPP_RET)p_Vid < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return (MPP_RET)p_Vid;
          }
          _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,0x1e7);
          return (MPP_RET)p_Vid;
        }
        MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,
                              _poc_used_bits->active_sps->log2_max_frame_num_minus4 + 4,&_out_5);
        recovery[3].first_frm_id = MVar3;
        if (recovery[3].first_frm_id == 0) {
          _poc_used_bits->frame_num = _out_5;
          if (__out_1->valid_flag != 0) {
            if (__out_1->first_frm_valid == 0) {
              __out_1->first_frm_id = _poc_used_bits->frame_num;
              __out_1->first_frm_valid = 1;
              __out_1->recovery_pic_id = __out_1->first_frm_id + __out_1->recovery_frame_cnt;
              if ((h264d_debug & 0x4000) != 0) {
                _mpp_log_l(4,"h264d_slice","First recovery frame found, frame_num %d",(char *)0x0,
                           (ulong)(uint)_poc_used_bits->frame_num);
              }
            }
            else if (__out_1->recovery_pic_id % (p_Cur->sps).direct_8x8_inference_flag <
                     _poc_used_bits->frame_num) {
              memset((p_Cur->sps).vui_seq_parameters.nal_hrd_parameters.bit_rate_value_minus1 + 0x16
                     ,0,0x14);
            }
          }
          if (_poc_used_bits->active_sps->frame_mbs_only_flag == 0) {
            MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,1,(RK_S32 *)&_out_6);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->field_pic_flag = _out_6;
            if (_poc_used_bits->field_pic_flag == 0) {
              (p_Cur->sps).pic_width_in_mbs_minus1 = 3;
              _poc_used_bits->bottom_field_flag = 0;
            }
            else {
              MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,1,(RK_S32 *)&_out_7);
              recovery[3].first_frm_id = MVar3;
              if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
              _poc_used_bits->bottom_field_flag = _out_7;
              RVar4 = 1;
              if (_poc_used_bits->bottom_field_flag != 0) {
                RVar4 = 2;
              }
              (p_Cur->sps).pic_width_in_mbs_minus1 = RVar4;
            }
          }
          else {
            (p_Cur->sps).pic_width_in_mbs_minus1 = 3;
            _poc_used_bits->field_pic_flag = 0;
            _poc_used_bits->bottom_field_flag = 0;
          }
          _poc_used_bits->structure = (p_Cur->sps).pic_width_in_mbs_minus1;
          local_95 = 0;
          if (_poc_used_bits->active_sps->mb_adaptive_frame_field_flag != 0) {
            local_95 = _poc_used_bits->field_pic_flag != 0 ^ 0xff;
          }
          _poc_used_bits->mb_aff_frame_flag = (uint)(local_95 & 1);
          if (_poc_used_bits->idr_flag == 0) {
            if ((_poc_used_bits->svc_extension_flag == 0) &&
               ((_poc_used_bits->mvcExt).non_idr_flag == 0)) {
              MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,(RK_U32 *)&_out_9);
              recovery[3].first_frm_id = MVar3;
              if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
              _poc_used_bits->idr_pic_id = _out_9;
            }
          }
          else {
            MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,(RK_U32 *)&_out_8);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->idr_pic_id = _out_8;
          }
          ret = recovery[2].first_frm_id;
          uVar1 = recovery[2].valid_flag;
          p_Vid._4_4_ = uVar1;
          if (_poc_used_bits->active_sps->pic_order_cnt_type == 0) {
            MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,
                                  _poc_used_bits->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4,
                                  &_out_10);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->pic_order_cnt_lsb = _out_10;
            if ((_poc_used_bits->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag ==
                 1) && (_poc_used_bits->field_pic_flag == 0)) {
              MVar3 = mpp_read_se((BitReadCtx_t *)recovery,&_out_11);
              recovery[3].first_frm_id = MVar3;
              if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
              _poc_used_bits->delta_pic_order_cnt_bottom = _out_11;
            }
            else {
              _poc_used_bits->delta_pic_order_cnt_bottom = 0;
            }
          }
          if (_poc_used_bits->active_sps->pic_order_cnt_type == 1) {
            if (_poc_used_bits->active_sps->delta_pic_order_always_zero_flag == 0) {
              MVar3 = mpp_read_se((BitReadCtx_t *)recovery,(RK_S32 *)&_out_12);
              recovery[3].first_frm_id = MVar3;
              if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
              _poc_used_bits->delta_pic_order_cnt[0] = _out_12;
              if ((_poc_used_bits->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag
                   == 1) && (_poc_used_bits->field_pic_flag == 0)) {
                MVar3 = mpp_read_se((BitReadCtx_t *)recovery,&_out_13);
                recovery[3].first_frm_id = MVar3;
                if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
                _poc_used_bits->delta_pic_order_cnt[1] = _out_13;
              }
              else {
                _poc_used_bits->delta_pic_order_cnt[1] = 0;
              }
            }
            else {
              _poc_used_bits->delta_pic_order_cnt[0] = 0;
              _poc_used_bits->delta_pic_order_cnt[1] = 0;
            }
          }
          uVar2 = recovery[2].valid_flag;
          p_Vid._4_4_ = uVar2 - p_Vid._4_4_;
          _poc_used_bits->poc_used_bitlen = (recovery[2].first_frm_id - ret) + p_Vid._4_4_ * -8;
          if ((((h264d_debug & 2) != 0) &&
              (_poc_used_bits->p_Vid->active_pps->redundant_pic_cnt_present_flag != 0)) &&
             (_mpp_log_l(2,"h264d_slice","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0",
                         "process_slice",0x22d), (mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          if (_poc_used_bits->p_Vid->active_pps->redundant_pic_cnt_present_flag != 0) {
            MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,(RK_U32 *)&_out_14);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->redundant_pic_cnt = _out_14;
          }
          if (_poc_used_bits->slice_type == 1) {
            MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,1,(RK_S32 *)&_out_15);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->direct_spatial_mv_pred_flag = _out_15;
          }
          else {
            _poc_used_bits->direct_spatial_mv_pred_flag = 0;
          }
          _poc_used_bits->num_ref_idx_active[0] =
               _poc_used_bits->p_Vid->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
          _poc_used_bits->num_ref_idx_active[1] =
               _poc_used_bits->p_Vid->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
          if (((_poc_used_bits->slice_type == 0) || (_poc_used_bits->slice_type == 3)) ||
             (_poc_used_bits->slice_type == 1)) {
            MVar3 = mpp_read_bits((BitReadCtx_t *)recovery,1,(RK_S32 *)&_out_16);
            recovery[3].first_frm_id = MVar3;
            if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
            _poc_used_bits->num_ref_idx_override_flag = _out_16;
            if (_poc_used_bits->num_ref_idx_override_flag != 0) {
              MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,&local_90);
              recovery[3].first_frm_id = MVar3;
              if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
              _poc_used_bits->num_ref_idx_active[0] = local_90;
              _poc_used_bits->num_ref_idx_active[0] = _poc_used_bits->num_ref_idx_active[0] + 1;
              if (_poc_used_bits->slice_type == 1) {
                MVar3 = mpp_read_ue((BitReadCtx_t *)recovery,&local_94);
                recovery[3].first_frm_id = MVar3;
                if (recovery[3].first_frm_id != 0) goto LAB_001bd439;
                _poc_used_bits->num_ref_idx_active[1] = local_94;
                _poc_used_bits->num_ref_idx_active[1] = _poc_used_bits->num_ref_idx_active[1] + 1;
              }
            }
          }
          if (_poc_used_bits->slice_type != 1) {
            _poc_used_bits->num_ref_idx_active[1] = 0;
          }
          p_Vid._0_4_ = ref_pic_list_mvc_modification(_poc_used_bits);
          if ((MPP_RET)p_Vid < MPP_OK) {
            if ((h264d_debug & 4) == 0) {
              return (MPP_RET)p_Vid;
            }
            _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,0x249);
            return (MPP_RET)p_Vid;
          }
          if ((((_poc_used_bits->p_Vid->active_pps->weighted_pred_flag != 0) &&
               ((_poc_used_bits->slice_type == 0 || (_poc_used_bits->slice_type == 3)))) ||
              ((_poc_used_bits->p_Vid->active_pps->weighted_bipred_idc == 1 &&
               (_poc_used_bits->slice_type == 1)))) &&
             (p_Vid._0_4_ = pred_weight_table(_poc_used_bits), (MPP_RET)p_Vid < MPP_OK)) {
            if ((h264d_debug & 4) == 0) {
              return (MPP_RET)p_Vid;
            }
            _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,0x24d);
            return (MPP_RET)p_Vid;
          }
          _poc_used_bits->drpm_used_bitlen = 0;
          if ((_poc_used_bits->nal_reference_idc != 0) &&
             (p_Vid._0_4_ = dec_ref_pic_marking(_poc_used_bits), (MPP_RET)p_Vid < MPP_OK)) {
            if ((h264d_debug & 4) == 0) {
              return (MPP_RET)p_Vid;
            }
            _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,0x251);
            return (MPP_RET)p_Vid;
          }
          if ((h264d_debug & 0x20) != 0) {
            _mpp_log_l(4,"h264d_slice",
                       "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d"
                       ,(char *)0x0,(ulong)(uint)_poc_used_bits->slice_type,
                       (ulong)(uint)_poc_used_bits->layer_id,
                       _poc_used_bits->active_sps->seq_parameter_set_id,
                       _poc_used_bits->active_pps->pic_parameter_set_id,_poc_used_bits->structure,
                       _poc_used_bits->frame_num);
          }
          return MPP_OK;
        }
      }
    }
  }
LAB_001bd439:
  return recovery[3].first_frm_id;
}

Assistant:

MPP_RET process_slice(H264_SLICE_t *currSlice)
{
    RK_U32 temp = 0;
    RK_U32 poc_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    RecoveryPoint *recovery = &p_Vid->recovery;

    //!< initial value
    currSlice->p_Dpb_layer[0] = p_Vid->p_Dpb_layer[0];
    currSlice->p_Dpb_layer[1] = p_Vid->p_Dpb_layer[1];

    //!< read slice head syntax
    READ_UE(p_bitctx, &currSlice->start_mb_nr); //!< first_mb_in_slice
    READ_UE(p_bitctx, &temp); //!< slice_type
    p_Vid->slice_type = currSlice->slice_type = temp % 5;
    if (p_Vid->slice_type == H264_SP_SLICE || p_Vid->slice_type == H264_SI_SLICE) {
        H264D_WARNNING("sp or si slice not support\n");
        goto __FAILED;
    }
    READ_UE(p_bitctx, &currSlice->pic_parameter_set_id);
    init_slice_parmeters(currSlice);
    FUN_CHECK(ret = set_slice_user_parmeters(currSlice));
    //!< read rest slice header syntax
    {
        READ_BITS(p_bitctx, currSlice->active_sps->log2_max_frame_num_minus4 + 4, &currSlice->frame_num);

        if (recovery->valid_flag) {
            if (!recovery->first_frm_valid) {
                recovery->first_frm_id = currSlice->frame_num;
                recovery->first_frm_valid = 1;
                recovery->recovery_pic_id = recovery->first_frm_id + recovery->recovery_frame_cnt;
                H264D_DBG(H264D_DBG_SEI, "First recovery frame found, frame_num %d", currSlice->frame_num);
            } else {
                // It may be too early to reset recovery point info when frame_num is wrapped
                if (recovery->recovery_pic_id % p_Vid->max_frame_num < currSlice->frame_num)
                    memset(&p_Vid->recovery, 0, sizeof(RecoveryPoint));
            }
        }

        if (currSlice->active_sps->frame_mbs_only_flag) { //!< user in_slice info
            p_Vid->structure = FRAME;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
        } else {
            READ_ONEBIT(p_bitctx, &currSlice->field_pic_flag);
            if (currSlice->field_pic_flag) {
                READ_ONEBIT(p_bitctx, &currSlice->bottom_field_flag);
                p_Vid->structure = currSlice->bottom_field_flag ? BOTTOM_FIELD : TOP_FIELD;
            } else {
                p_Vid->structure = FRAME;
                currSlice->bottom_field_flag = 0;
            }
        }
        currSlice->structure = p_Vid->structure;
        currSlice->mb_aff_frame_flag = currSlice->active_sps->mb_adaptive_frame_field_flag &&
                                       !currSlice->field_pic_flag;
        if (currSlice->idr_flag) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        } else if (currSlice->svc_extension_flag == 0 && currSlice->mvcExt.non_idr_flag == 0) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        }
        poc_used_bits = p_bitctx->used_bits; //!< init poc used bits
        emulation_prevention = p_bitctx->emulation_prevention_bytes_;
        if (currSlice->active_sps->pic_order_cnt_type == 0) {
            READ_BITS(p_bitctx, currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4, &currSlice->pic_order_cnt_lsb);
            if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1
                && !currSlice->field_pic_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt_bottom);
            } else {
                currSlice->delta_pic_order_cnt_bottom = 0;
            }
        }
        if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (!currSlice->active_sps->delta_pic_order_always_zero_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[0]);

                if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1 && !currSlice->field_pic_flag) {
                    READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[1]);
                } else {
                    currSlice->delta_pic_order_cnt[1] = 0;  //!< set to zero if not in stream
                }
            } else {
                currSlice->delta_pic_order_cnt[0] = 0;
                currSlice->delta_pic_order_cnt[1] = 0;
            }
        }

        // need to minus emulation prevention bytes(0x000003) we met
        emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
        currSlice->poc_used_bitlen = p_bitctx->used_bits - poc_used_bits - (emulation_prevention * 8); //!< calculate poc used bit length
        //!< redundant_pic_cnt is missing here
        ASSERT(currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0); // add by dw, high 4:2:2 profile not support
        if (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag) {
            READ_UE(p_bitctx, &currSlice->redundant_pic_cnt);
        }

        if (currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->direct_spatial_mv_pred_flag);
        } else {
            currSlice->direct_spatial_mv_pred_flag = 0;
        }
        currSlice->num_ref_idx_active[LIST_0] = currSlice->p_Vid->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
        currSlice->num_ref_idx_active[LIST_1] = currSlice->p_Vid->active_pps->num_ref_idx_l1_default_active_minus1 + 1;

        if (currSlice->slice_type == H264_P_SLICE
            || currSlice->slice_type == H264_SP_SLICE || currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->num_ref_idx_override_flag);
            if (currSlice->num_ref_idx_override_flag) {
                READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_0]);
                currSlice->num_ref_idx_active[LIST_0] += 1;
                if (currSlice->slice_type == H264_B_SLICE) {
                    READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_1]);
                    currSlice->num_ref_idx_active[LIST_1] += 1;
                }
            }
        }
        if (currSlice->slice_type != H264_B_SLICE) {
            currSlice->num_ref_idx_active[LIST_1] = 0;
        }
        FUN_CHECK(ret = ref_pic_list_mvc_modification(currSlice));
        if ((currSlice->p_Vid->active_pps->weighted_pred_flag
             && (currSlice->slice_type == H264_P_SLICE || currSlice->slice_type == H264_SP_SLICE))
            || (currSlice->p_Vid->active_pps->weighted_bipred_idc == 1 && (currSlice->slice_type == H264_B_SLICE))) {
            FUN_CHECK(ret = pred_weight_table(currSlice));
        }
        currSlice->drpm_used_bitlen = 0;
        if (currSlice->nal_reference_idc) {
            FUN_CHECK(ret = dec_ref_pic_marking(currSlice));
        }
        H264D_DBG(H264D_DBG_PPS_SPS, "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d",
                  currSlice->slice_type, currSlice->layer_id, currSlice->active_sps->seq_parameter_set_id,
                  currSlice->active_pps->pic_parameter_set_id, currSlice->structure, currSlice->frame_num);
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}